

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall wallet::wallet_tests::WatchOnlyPubKeys::test_method(WatchOnlyPubKeys *this)

{
  bool bVar1;
  LegacyScriptPubKeyMan *spk_man;
  pointer *__ptr;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar2;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  assertion_result local_f8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 local_c0 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_b8;
  undefined1 local_b0 [24];
  char **local_98;
  CPubKey local_69;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0[0] = false;
  local_b8._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  local_69.vch[0] = 0xff;
  spk_man = CWallet::GetOrCreateLegacyScriptPubKeyMan
                      (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x228;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  bVar1 = LegacyDataSPKM::HaveWatchOnly(&spk_man->super_LegacyDataSPKM);
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98 = &local_108;
  local_108 = "!spk_man->HaveWatchOnly()";
  local_100 = "";
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_01389048;
  local_b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_110 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,(lazy_ostream *)local_b0,1,0,WARN,_cVar2,(size_t)&local_118,0x228);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  CKey::MakeNewKey((CKey *)local_c0,false);
  CKey::GetPubKey((CPubKey *)local_b0,(CKey *)local_c0);
  memcpy(&local_69,local_b0,0x41);
  if ((local_69.vch[0] & 0xfe) == 2) {
    __assert_fail("!pubkey.IsCompressed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x22d,"void wallet::wallet_tests::WatchOnlyPubKeys::test_method()");
  }
  TestWatchOnlyPubKey(spk_man,&local_69);
  PollutePubKey(&local_69);
  TestWatchOnlyPubKey(spk_man,&local_69);
  CKey::MakeNewKey((CKey *)local_c0,true);
  CKey::GetPubKey((CPubKey *)local_b0,(CKey *)local_c0);
  memcpy(&local_69,local_b0,0x41);
  if ((local_69.vch[0] & 0xfe) == 2) {
    TestWatchOnlyPubKey(spk_man,&local_69);
    PollutePubKey(&local_69);
    TestWatchOnlyPubKey(spk_man,&local_69);
    local_69.vch[0] = 0xff;
    TestWatchOnlyPubKey(spk_man,&local_69);
    if (local_b8._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_b8,
                 local_b8._M_head_impl);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("pubkey.IsCompressed()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ,0x237,"void wallet::wallet_tests::WatchOnlyPubKeys::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(WatchOnlyPubKeys)
{
    CKey key;
    CPubKey pubkey;
    LegacyScriptPubKeyMan* spk_man = m_wallet.GetOrCreateLegacyScriptPubKeyMan();

    BOOST_CHECK(!spk_man->HaveWatchOnly());

    // uncompressed valid PubKey
    key.MakeNewKey(false);
    pubkey = key.GetPubKey();
    assert(!pubkey.IsCompressed());
    TestWatchOnlyPubKey(spk_man, pubkey);

    // uncompressed cryptographically invalid PubKey
    PollutePubKey(pubkey);
    TestWatchOnlyPubKey(spk_man, pubkey);

    // compressed valid PubKey
    key.MakeNewKey(true);
    pubkey = key.GetPubKey();
    assert(pubkey.IsCompressed());
    TestWatchOnlyPubKey(spk_man, pubkey);

    // compressed cryptographically invalid PubKey
    PollutePubKey(pubkey);
    TestWatchOnlyPubKey(spk_man, pubkey);

    // invalid empty PubKey
    pubkey = CPubKey();
    TestWatchOnlyPubKey(spk_man, pubkey);
}